

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuVector.hpp
# Opt level: O3

void deqp::gles3::Functional::eval_anyNotEqual_ivec4(ShaderEvalContext *c)

{
  bool bVar1;
  int i;
  long lVar2;
  bool bVar3;
  Vector<int,_4> res_1;
  Vector<int,_4> res;
  
  res.m_data[0] = (int)c->in[0].m_data[1];
  res.m_data[1] = (int)c->in[0].m_data[2];
  res.m_data[2] = (int)c->in[0].m_data[3];
  res.m_data[3] = (int)c->in[0].m_data[0];
  res_1.m_data[0] = (int)c->in[1].m_data[3];
  res_1.m_data[1] = (int)c->in[1].m_data[2];
  res_1.m_data[2] = (int)c->in[1].m_data[1];
  res_1.m_data[3] = (int)c->in[1].m_data[0];
  lVar2 = 0;
  bVar3 = false;
  do {
    bVar1 = !bVar3;
    bVar3 = true;
    if (bVar1) {
      bVar3 = res.m_data[lVar2] != res_1.m_data[lVar2];
    }
    lVar2 = lVar2 + 1;
  } while (lVar2 != 4);
  (c->color).m_data[0] = (float)bVar3;
  return;
}

Assistant:

Vector<T, 4>			swizzle		(int a, int b, int c, int d) const { DE_ASSERT(a >= 0 && a < Size); DE_ASSERT(b >= 0 && b < Size); DE_ASSERT(c >= 0 && c < Size); DE_ASSERT(d >= 0 && d < Size); return Vector<T, 4>(m_data[a], m_data[b], m_data[c], m_data[d]); }